

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  SessionHandle *data;
  void *pvVar2;
  CURLcode CVar3;
  short *psVar4;
  size_t sVar5;
  curl_write_callback p_Var6;
  char *pcVar7;
  short *psVar8;
  
  data = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((data->req).keepon & 0x10) != 0) {
    if ((data->state).tempwritetype != type) {
      return CURLE_RECV_ERROR;
    }
    sVar5 = (data->state).tempwritesize + len;
    pcVar7 = (char *)(*Curl_crealloc)((data->state).tempwrite,sVar5);
    if (pcVar7 != (char *)0x0) {
      memcpy(pcVar7 + (data->state).tempwritesize,ptr,len);
      (data->state).tempwrite = pcVar7;
      (data->state).tempwritesize = sVar5;
      return CURLE_OK;
    }
    return CURLE_OUT_OF_MEMORY;
  }
  if ((type & 1U) != 0) {
    if ((((conn->handler->protocol & 0xc) != 0) && ((conn->proto).ftpc.transfertype == 'A')) &&
       (len != 0 && ptr != (char *)0x0)) {
      if ((data->state).prev_block_had_trailing_cr == true) {
        if (*ptr == '\n') {
          len = len - 1;
          memmove(ptr,ptr + 1,len);
          pcVar1 = &(data->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        (data->state).prev_block_had_trailing_cr = false;
      }
      psVar4 = (short *)memchr(ptr,0xd,len);
      if (psVar4 != (short *)0x0) {
        psVar8 = psVar4;
        for (; psVar4 < ptr + (len - 1); psVar4 = (short *)((long)psVar4 + 1)) {
          if (*psVar4 == 0xa0d) {
            pcVar7 = (char *)((long)psVar4 + 1);
            psVar4 = (short *)((long)psVar4 + 1);
            *(char *)psVar8 = *pcVar7;
            pcVar1 = &(data->state).crlf_conversions;
            *pcVar1 = *pcVar1 + 1;
          }
          else if ((char)*psVar4 == '\r') {
            *(char *)psVar8 = '\n';
          }
          else {
            *(char *)psVar8 = (char)*psVar4;
          }
          psVar8 = (short *)((long)psVar8 + 1);
        }
        if (psVar4 < ptr + len) {
          if ((char)*psVar4 == '\r') {
            *(char *)psVar8 = '\n';
            (data->state).prev_block_had_trailing_cr = true;
          }
          else {
            *(char *)psVar8 = (char)*psVar4;
          }
          psVar8 = (short *)((long)psVar8 + 1);
        }
        if (psVar8 < ptr + len) {
          *(char *)psVar8 = '\0';
        }
        len = (long)psVar8 - (long)ptr;
      }
    }
    if (len == 0) {
      sVar5 = 0;
    }
    else {
      sVar5 = (*(data->set).fwrite_func)(ptr,1,len,(data->set).out);
      if (sVar5 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_0043743c;
        pcVar7 = "Write callback asked for PAUSE when not supported!";
        goto LAB_00437480;
      }
    }
    if (sVar5 != len) {
      Curl_failf(data,"Failed writing body (%zu != %zu)",sVar5,len);
      return CURLE_WRITE_ERROR;
    }
  }
  if ((type & 2U) == 0) {
    return CURLE_OK;
  }
  pvVar2 = (data->set).writeheader;
  p_Var6 = (data->set).fwrite_header;
  if (p_Var6 == (curl_write_callback)0x0) {
    if (pvVar2 == (void *)0x0) {
      return CURLE_OK;
    }
    p_Var6 = (data->set).fwrite_func;
  }
  sVar5 = (*p_Var6)(ptr,1,len,pvVar2);
  if (sVar5 == 0x10000001) {
    type = 2;
LAB_0043743c:
    CVar3 = pausewrite(data,type,ptr,len);
    return CVar3;
  }
  if (sVar5 == len) {
    return CURLE_OK;
  }
  pcVar7 = "Failed writing header";
LAB_00437480:
  Curl_failf(data,pcVar7);
  return CURLE_WRITE_ERROR;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct SessionHandle *data = conn->data;
  size_t wrote;

  if(0 == len)
    len = strlen(ptr);

  /* If reading is actually paused, we're forced to append this chunk of data
     to the already held data, but only if it is the same type as otherwise it
     can't work and it'll return error instead. */
  if(data->req.keepon & KEEP_RECV_PAUSE) {
    size_t newlen;
    char *newptr;
    if(type != data->state.tempwritetype)
      /* major internal confusion */
      return CURLE_RECV_ERROR;

    DEBUGASSERT(data->state.tempwrite);

    /* figure out the new size of the data to save */
    newlen = len + data->state.tempwritesize;
    /* allocate the new memory area */
    newptr = realloc(data->state.tempwrite, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + data->state.tempwritesize, ptr, len);
    /* update the pointer and the size */
    data->state.tempwrite = newptr;
    data->state.tempwritesize = newlen;

    return CURLE_OK;
  }

  if(type & CLIENTWRITE_BODY) {
    if((conn->handler->protocol&PROTO_FAMILY_FTP) &&
       conn->proto.ftpc.transfertype == 'A') {
      /* convert from the network encoding */
      CURLcode rc = Curl_convert_from_network(data, ptr, len);
      /* Curl_convert_from_network calls failf if unsuccessful */
      if(rc)
        return rc;

#ifdef CURL_DO_LINEEND_CONV
      /* convert end-of-line markers */
      len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }
    /* If the previous block of data ended with CR and this block of data is
       just a NL, then the length might be zero */
    if(len) {
      wrote = data->set.fwrite_func(ptr, 1, len, data->set.out);
    }
    else {
      wrote = len;
    }

    if(CURL_WRITEFUNC_PAUSE == wrote) {
      if(conn->handler->flags & PROTOPT_NONETWORK) {
        /* Protocols that work without network cannot be paused. This is
           actually only FILE:// just now, and it can't pause since the
           transfer isn't done using the "normal" procedure. */
        failf(data, "Write callback asked for PAUSE when not supported!");
        return CURLE_WRITE_ERROR;
      }
      else
        return pausewrite(data, type, ptr, len);
    }
    else if(wrote != len) {
      failf(data, "Failed writing body (%zu != %zu)", wrote, len);
      return CURLE_WRITE_ERROR;
    }
  }

  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader) ) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    curl_write_callback writeit=
      data->set.fwrite_header?data->set.fwrite_header:data->set.fwrite_func;

    /* Note: The header is in the host encoding
       regardless of the ftp transfer mode (ASCII/Image) */

    wrote = writeit(ptr, 1, len, data->set.writeheader);
    if(CURL_WRITEFUNC_PAUSE == wrote)
      /* here we pass in the HEADER bit only since if this was body as well
         then it was passed already and clearly that didn't trigger the pause,
         so this is saved for later with the HEADER bit only */
      return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

    if(wrote != len) {
      failf (data, "Failed writing header");
      return CURLE_WRITE_ERROR;
    }
  }

  return CURLE_OK;
}